

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall kwssys::RegExpCompile::regbranch(RegExpCompile *this,int *flagp)

{
  char *pcVar1;
  char *p;
  uint *in_RSI;
  RegExpCompile *in_RDI;
  bool bVar2;
  int *in_stack_00000010;
  int flags;
  char *latest;
  char *chain;
  char *ret;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  char *local_28;
  
  *in_RSI = 0;
  pcVar1 = regnode(in_RDI,'\x06');
  local_28 = (char *)0x0;
  while( true ) {
    bVar2 = false;
    if ((*in_RDI->regparse != '\0') && (bVar2 = false, *in_RDI->regparse != '|')) {
      bVar2 = *in_RDI->regparse != ')';
    }
    if (!bVar2) break;
    p = regpiece((RegExpCompile *)latest,in_stack_00000010);
    if (p == (char *)0x0) {
      return (char *)0x0;
    }
    *in_RSI = in_stack_ffffffffffffffcc & 1 | *in_RSI;
    if (local_28 == (char *)0x0) {
      *in_RSI = in_stack_ffffffffffffffcc & 4 | *in_RSI;
      local_28 = p;
    }
    else {
      regtail(p,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_28 = p;
    }
  }
  if (local_28 != (char *)0x0) {
    return pcVar1;
  }
  regnode(in_RDI,'\t');
  return pcVar1;
}

Assistant:

char* RegExpCompile::regbranch(int* flagp)
{
  char* ret;
  char* chain;
  char* latest;
  int flags;

  *flagp = WORST; // Tentatively.

  ret = regnode(BRANCH);
  chain = nullptr;
  while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
    latest = regpiece(&flags);
    if (latest == nullptr)
      return (nullptr);
    *flagp |= flags & HASWIDTH;
    if (chain == nullptr) // First piece.
      *flagp |= flags & SPSTART;
    else
      regtail(chain, latest);
    chain = latest;
  }
  if (chain == nullptr) // Loop ran zero times.
    regnode(NOTHING);

  return (ret);
}